

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::PatchablePropertyWithThisPtr
          (ByteCodeWriter *this,OpCode op,RegSlot value,RegSlot instance,RegSlot thisInstance,
          uint cacheId,bool isCtor,bool registerCacheIdForCall)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  RegSlot instance_00;
  RegSlot value2;
  undefined4 *puVar3;
  bool success;
  CacheIdUnit unit;
  bool registerCacheIdForCall_local;
  bool isCtor_local;
  uint cacheId_local;
  RegSlot thisInstance_local;
  RegSlot instance_local;
  RegSlot value_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  unit._7_1_ = isCtor;
  unit._6_1_ = registerCacheIdForCall;
  thisInstance_local = value;
  instance_local._2_2_ = op;
  _value_local = this;
  CheckOpen(this);
  op_00 = instance_local._2_2_;
  OpLayoutType::OpLayoutType((OpLayoutType *)&unit,ElementC2);
  CheckOp(this,op_00,(OpLayoutType)unit.cacheId);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(instance_local._2_2_);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x890,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  thisInstance_local = ConsumeReg(this,thisInstance_local);
  instance_00 = ConsumeReg(this,instance);
  value2 = ConsumeReg(this,thisInstance);
  if (instance_local._2_2_ == LdSuperFld) {
    if (((unit._7_1_ & 1) != 0) && ((unit._6_1_ & 1) != 0)) {
      CacheIdUnit::CacheIdUnit((CacheIdUnit *)&stack0xffffffffffffffcc,cacheId,false);
      bVar2 = JsUtil::
              BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::TryGetValue<unsigned_int>
                        (this->callRegToLdFldCacheIndexMap,&thisInstance_local,
                         (CacheIdUnit *)&stack0xffffffffffffffcc);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x89e,
                                    "(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit))",
                                    "!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      JsUtil::
      BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Add(this->callRegToLdFldCacheIndexMap,&thisInstance_local,
            (CacheIdUnit *)&stack0xffffffffffffffcc);
    }
    bVar2 = DoDynamicProfileOpcode(this,AggressiveIntTypeSpecPhase,false);
    if (((bVar2) || (bVar2 = DoDynamicProfileOpcode(this,FloatTypeSpecPhase,false), bVar2)) ||
       ((bVar2 = DoDynamicProfileOpcode(this,ObjTypeSpecPhase,false), bVar2 ||
        ((bVar2 = DoDynamicProfileOpcode(this,InlinePhase,false), bVar2 ||
         (bVar2 = DoDynamicProfileOpcode(this,ProfileBasedFldFastPathPhase,false), bVar2)))))) {
      OpCodeUtil::ConvertNonCallOpToProfiled((OpCode *)((long)&instance_local + 2));
    }
  }
  else if ((instance_local._2_2_ == StSuperFld) || (instance_local._2_2_ == StSuperFldStrict)) {
    bVar2 = DoDynamicProfileOpcode(this,ProfileBasedFldFastPathPhase,false);
    if (((bVar2) || (bVar2 = DoDynamicProfileOpcode(this,InlinePhase,false), bVar2)) ||
       (bVar2 = DoDynamicProfileOpcode(this,ObjTypeSpecPhase,false), bVar2)) {
      OpCodeUtil::ConvertNonCallOpToProfiled((OpCode *)((long)&instance_local + 2));
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x8b5,"(false)",
                                "The specified OpCode is not intended for patchable super field-access"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = TryWriteElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,instance_local._2_2_,thisInstance_local,instance_00,cacheId,value2);
  if (((!bVar2) &&
      (bVar2 = TryWriteElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,instance_local._2_2_,thisInstance_local,instance_00,cacheId,value2),
      !bVar2)) &&
     (bVar2 = TryWriteElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,instance_local._2_2_,thisInstance_local,instance_00,cacheId,value2),
     !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x8b9,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::PatchablePropertyWithThisPtr(OpCode op, RegSlot value, RegSlot instance, RegSlot thisInstance, uint cacheId, bool isCtor, bool registerCacheIdForCall)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementC2);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);
        instance = ConsumeReg(instance);
        thisInstance = ConsumeReg(thisInstance);

        switch (op)
        {
        case OpCode::LdSuperFld:
            if (isCtor) // The symbol loaded by this LdSuperFld will be used as a constructor
            {
                if (registerCacheIdForCall)
                {
                    CacheIdUnit unit(cacheId);
                    Assert(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit));
                    callRegToLdFldCacheIndexMap->Add(value, unit);
                }
            }
            if (DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) ||
                DoDynamicProfileOpcode(FloatTypeSpecPhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;
        case OpCode::StSuperFld:
        case OpCode::StSuperFldStrict:
            if (DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;
        default:
            AssertMsg(false, "The specified OpCode is not intended for patchable super field-access");
            break;
        }

        MULTISIZE_LAYOUT_WRITE(ElementC2, op, value, instance, cacheId, thisInstance);
    }